

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::MapBufferRangeCase::testBufferUpload
          (MapBufferRangeCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
          *result,int bufferSize)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  deUint64 dVar4;
  deUint64 dVar5;
  void *dst;
  undefined8 *puVar6;
  TestError *this_00;
  long lVar7;
  allocator<char> local_71;
  Exception *local_70;
  int local_64;
  long local_60;
  long local_58;
  string local_50;
  long lVar3;
  
  local_64 = bufferSize / 2;
  local_60 = (long)bufferSize;
  local_58 = (long)(bufferSize / 4);
  if (3 < this->m_unmapFailures) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38,result,(long)bufferSize % 4 & 0xffffffff);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Unmapping failures exceeded limit",&local_71);
    tcu::TestError::TestError(this_00,&local_50);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*((this->
             super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
             .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0x40))
            (0x8892,(this->
                    super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                    ).
                    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                    .m_bufferID);
  iVar2 = local_64;
  if (this->m_fullUpload != false) {
    iVar2 = bufferSize;
  }
  result->writtenSize = iVar2;
  if ((this->m_manualInvalidation == false) && (this->m_useUnusedUnspecifiedBuffer != true)) {
    if (this->m_useUnusedSpecifiedBuffer != true) {
      dVar5 = 0;
      goto LAB_006de05a;
    }
    dVar4 = deGetMicroseconds();
    (**(code **)(lVar3 + 0x150))
              (0x8892,local_60,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
               ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
               ).m_bufferUsage);
  }
  else {
    dVar4 = deGetMicroseconds();
    (**(code **)(lVar3 + 0x150))
              (0x8892,local_60,0,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
               ).m_bufferUsage);
  }
  dVar5 = deGetMicroseconds();
  dVar5 = dVar5 - dVar4;
LAB_006de05a:
  (result->duration).allocDuration = dVar5;
  dVar5 = deGetMicroseconds();
  lVar7 = local_58;
  if (this->m_fullUpload != false) {
    lVar7 = 0;
  }
  dst = (void *)(**(code **)(lVar3 + 0xd00))
                          (0x8892,lVar7,(long)result->writtenSize,this->m_mapFlags);
  dVar4 = deGetMicroseconds();
  if (dst != (void *)0x0) {
    (result->duration).mapDuration = dVar4 - dVar5;
    dVar5 = medianTimeMemcpy(dst,(this->
                                 super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                                 ).m_zeroData.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,result->writtenSize);
    (result->duration).writeDuration = dVar5;
    dVar5 = deGetMicroseconds();
    cVar1 = (**(code **)(lVar3 + 0x1670))(0x8892);
    dVar4 = deGetMicroseconds();
    if (cVar1 == '\0') {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = &PTR__exception_00c2b6f8;
      __cxa_throw(puVar6,&(anonymous_namespace)::UnmapFailureError::typeinfo,
                  std::exception::~exception);
    }
    (result->duration).unmapDuration = dVar4 - dVar5;
    dVar5 = (dVar4 - dVar5) + (result->duration).mapDuration + (result->duration).writeDuration +
            (result->duration).allocDuration;
    (result->duration).totalDuration = dVar5;
    (result->duration).fitResponseDuration = dVar5;
    return;
  }
  local_70 = (Exception *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"MapBufferRange returned NULL",&local_71);
  tcu::Exception::Exception(local_70,&local_50);
  __cxa_throw(local_70,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MapBufferRangeCase::testBufferUpload (UploadSampleResult<MapBufferRangeDuration>& result, int bufferSize)
{
	const int unmapFailureThreshold = 4;

	for (; m_unmapFailures < unmapFailureThreshold; ++m_unmapFailures)
	{
		try
		{
			attemptBufferMap(result, bufferSize);
			return;
		}
		catch (UnmapFailureError&)
		{
		}
	}

	throw tcu::TestError("Unmapping failures exceeded limit");
}